

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_channels(exr_context_t ctxt,int part_index,char *name,exr_attr_chlist_t *channels)

{
  undefined8 *puVar1;
  int iVar2;
  exr_result_t eVar3;
  int *in_RCX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_pixel_type_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_attr_chlist_entry_t *cur;
  int c;
  int numchans;
  exr_attr_chlist_t clist;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  int local_60;
  undefined4 local_58;
  int in_stack_ffffffffffffffac;
  exr_attr_chlist_t *in_stack_ffffffffffffffb0;
  exr_attr_chlist_t *in_stack_ffffffffffffffb8;
  _internal_exr_part *ctxt_00;
  undefined8 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  long lVar6;
  undefined4 in_stack_ffffffffffffffe8;
  exr_perceptual_treatment_t in_stack_fffffffffffffffc;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar6 = 0;
  uVar5 = 0;
  if ((in_RDX != (exr_attribute_list_t *)0x0) &&
     (iVar2 = strcmp((char *)in_RDX,"channels"), iVar2 == 0)) {
    eVar3 = exr_set_channels((exr_context_t)CONCAT44(uVar5,in_stack_ffffffffffffffc8),iVar4,
                             in_stack_ffffffffffffffb8);
    return eVar3;
  }
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar3 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar3 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      ctxt_00 = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\x01') {
        if (in_RCX == (int *)0x0) {
          internal_exr_unlock(in_RDI);
          eVar3 = (*in_RDI->print_error)
                            (in_RDI,3,"No input values for setting \'%s\', type \'chlist\'",in_RDX);
        }
        else {
          eVar3 = exr_attr_list_find_by_name
                            ((exr_const_context_t)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                             (exr_attribute_list_t *)in_RDI,(char *)ctxt_00,
                             (exr_attribute_t **)in_stack_ffffffffffffffb0);
          if (eVar3 == 0xf) {
            eVar3 = exr_attr_list_add((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      in_RDX,(char *)in_RCX,
                                      (exr_attribute_type_t)((ulong)lVar6 >> 0x20),(int32_t)lVar6,
                                      (uint8_t **)CONCAT44(0xf,in_stack_ffffffffffffffc8),
                                      (exr_attribute_t **)CONCAT44(unaff_retaddr_00,unaff_retaddr));
          }
          if (eVar3 == 0) {
            if (in_RCX == (int *)0x0) {
              internal_exr_unlock(in_RDI);
              eVar3 = (*in_RDI->report_error)(in_RDI,3,"No channels provided for channel list");
              return eVar3;
            }
            iVar4 = *in_RCX;
            eVar3 = exr_attr_chlist_init
                              ((exr_context_t)ctxt_00,in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffac);
            if (eVar3 != 0) {
              internal_exr_unlock(in_RDI);
              return eVar3;
            }
            for (local_60 = 0; eVar3 = 0, local_60 < iVar4; local_60 = local_60 + 1) {
              eVar3 = exr_attr_chlist_add_with_length
                                (_c,(exr_attr_chlist_t *)cur,in_stack_00000008,unaff_retaddr_00,
                                 unaff_retaddr,in_stack_fffffffffffffffc,(int32_t)part,
                                 (int32_t)pctxt);
              if (eVar3 != 0) {
                exr_attr_chlist_destroy((exr_context_t)ctxt_00,in_stack_ffffffffffffffb0);
                internal_exr_unlock(in_RDI);
                return eVar3;
              }
            }
            exr_attr_chlist_destroy((exr_context_t)ctxt_00,in_stack_ffffffffffffffb0);
            puVar1 = *(undefined8 **)(lVar6 + 0x18);
            *puVar1 = CONCAT44(in_stack_ffffffffffffffac,local_58);
            puVar1[1] = in_stack_ffffffffffffffb0;
          }
          internal_exr_unlock(in_RDI);
        }
      }
      else {
        internal_exr_unlock(in_RDI);
        eVar3 = (*in_RDI->standard_error)(in_RDI,8);
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_channels (
    exr_context_t            ctxt,
    int                      part_index,
    const char*              name,
    const exr_attr_chlist_t* channels)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    if (name && 0 == strcmp (name, EXR_REQ_CHANNELS_STR))
        return exr_set_channels (ctxt, part_index, channels);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    /* do not support updating channels during update operation... */
    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (!channels)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'chlist'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_CHLIST, 0, NULL, &(attr));
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;
        int               numchans;

        if (!channels)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "No channels provided for channel list"));

        numchans = channels->num_channels;
        rv       = exr_attr_chlist_init (ctxt, &clist, numchans);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        for (int c = 0; c < numchans; ++c)
        {
            const exr_attr_chlist_entry_t* cur = channels->entries + c;

            rv = exr_attr_chlist_add_with_length (
                ctxt,
                &clist,
                cur->name.str,
                cur->name.length,
                cur->pixel_type,
                (exr_perceptual_treatment_t) cur->p_linear,
                cur->x_sampling,
                cur->y_sampling);
            if (rv != EXR_ERR_SUCCESS)
            {
                exr_attr_chlist_destroy (ctxt, &clist);
                return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
            }
        }

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}